

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

bool internalJSONNode::AreEqualNoCase(char *ch_one,char *ch_two)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  
  do {
    bVar1 = *ch_one;
    bVar2 = *ch_two;
    if (bVar1 == 0) {
      return bVar2 == 0;
    }
    if (bVar1 == bVar2) {
LAB_00118064:
      ch_one = (char *)((byte *)ch_one + 1);
      ch_two = (char *)((byte *)ch_two + 1);
      bVar3 = true;
    }
    else {
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        if (bVar1 != (byte)(bVar2 - 0x20) || 0x19 < (byte)(bVar2 + 0x9f)) goto LAB_00118096;
        goto LAB_00118064;
      }
      if (bVar1 == (bVar2 | 0x20)) goto LAB_00118064;
LAB_00118096:
      bVar3 = false;
    }
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool internalJSONNode::AreEqualNoCase(const json_char * ch_one, const json_char * ch_two) json_nothrow {
	   while (*ch_one){  //only need to check one, if the other one terminates early, the check will cause it to fail
		  const json_char c_one = *ch_one;
		  const json_char c_two = *ch_two;
		  if (c_one != c_two){
			 if ((c_two > 64) && (c_two < 91)){  //A - Z
				if (c_one != (json_char)(c_two + 32)) return false;
			 } else if ((c_two > 96) && (c_two < 123)){  //a - z
				if (c_one != (json_char)(c_two - 32)) return false;
			 } else { //not a letter, so return false
				return false;
			 }
		  }
		  ++ch_one;
		  ++ch_two;

	   }
	   return *ch_two == '\0';  //this one has to be null terminated too, or else json_string two is longer, hence, not equal
    }